

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  undefined8 uVar1;
  int iVar2;
  ImGuiColumns *pIVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ImGuiColumns *pIVar7;
  byte bVar8;
  ImGuiColumns IStack_98;
  
  bVar8 = 0;
  lVar5 = (long)(window->ColumnsStorage).Size;
  if (0 < lVar5) {
    pIVar3 = (window->ColumnsStorage).Data;
    do {
      if (pIVar3->ID == id) {
        return pIVar3;
      }
      pIVar3 = pIVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  ImGuiColumns::ImGuiColumns(&IStack_98);
  iVar2 = (window->ColumnsStorage).Size;
  if (iVar2 == (window->ColumnsStorage).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar6 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar6 = iVar4;
    }
    pIVar3 = (ImGuiColumns *)MemAlloc((long)iVar6 * 0x78);
    pIVar7 = (window->ColumnsStorage).Data;
    if (pIVar7 != (ImGuiColumns *)0x0) {
      memcpy(pIVar3,pIVar7,(long)(window->ColumnsStorage).Size * 0x78);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar3;
    (window->ColumnsStorage).Capacity = iVar6;
    iVar2 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar3 = (window->ColumnsStorage).Data;
  }
  pIVar7 = &IStack_98;
  pIVar3 = pIVar3 + iVar2;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar1 = *(undefined8 *)pIVar7;
    pIVar3->ID = (int)uVar1;
    pIVar3->Flags = (int)((ulong)uVar1 >> 0x20);
    pIVar7 = (ImGuiColumns *)((long)pIVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    pIVar3 = (ImGuiColumns *)((long)pIVar3 + (ulong)bVar8 * -0x10 + 8);
  }
  (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
  ImDrawListSplitter::ClearFreeMemory(&IStack_98.Splitter);
  if (IStack_98.Splitter._Channels.Data != (ImDrawChannel *)0x0) {
    MemFree(IStack_98.Splitter._Channels.Data);
  }
  if (IStack_98.Columns.Data != (ImGuiColumnData *)0x0) {
    MemFree(IStack_98.Columns.Data);
  }
  lVar5 = (long)(window->ColumnsStorage).Size;
  if (0 < lVar5) {
    pIVar3 = (window->ColumnsStorage).Data + lVar5 + -1;
    pIVar3->ID = id;
    return pIVar3;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x538,"T &ImVector<ImGuiColumns>::back() [T = ImGuiColumns]");
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}